

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_test.c
# Opt level: O2

void test_cv_cancel(testing t)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  nsync_note cancel_note;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  bool bVar8;
  nsync_time b;
  nsync_time b_00;
  nsync_time nVar9;
  nsync_time nVar10;
  nsync_time nVar11;
  nsync_time nVar12;
  nsync_cv cv;
  nsync_mu mu;
  
  nsync_mu_init(&mu);
  nsync_cv_init(&cv);
  b = nsync_time_ms(1);
  b_00 = nsync_time_ms(100);
  nVar9 = nsync_time_now();
  nVar10 = nsync_time_ms(3600000);
  nVar9 = nsync_time_add(nVar9,nVar10);
  nsync_mu_lock(&mu);
  iVar1 = 0x32;
  uVar7 = 0;
  while( true ) {
    bVar8 = iVar1 == 0;
    iVar1 = iVar1 + -1;
    if (bVar8) break;
    nVar10 = nsync_time_now();
    nVar11 = nsync_time_ms(0x57);
    nVar10 = nsync_time_add(nVar10,nVar11);
    cancel_note = nsync_note_new((nsync_note)0x0,nVar10);
    uVar2 = nsync_cv_wait_with_deadline(&cv,&mu,nVar9,cancel_note);
    if (uVar2 != 0x7d) {
      pcVar5 = smprintf("nsync_cv_wait() returned non-cancelled (%d) for a cancellation; expected %d"
                        ,(ulong)uVar2,0x7d);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x11e,pcVar5);
    }
    nVar11 = nsync_time_now();
    nVar12 = nsync_time_sub(nVar10,b);
    iVar3 = nsync_time_cmp(nVar11,nVar12);
    if (iVar3 < 0) {
      nVar12 = nsync_time_sub(nVar10,nVar11);
      pcVar5 = nsync_time_str(nVar12,2);
      pcVar6 = smprintf("nsync_cv_wait() returned %s too early",pcVar5);
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x123,pcVar6);
      free(pcVar5);
    }
    nVar12 = nsync_time_add(nVar10,b_00);
    iVar3 = nsync_time_cmp(nVar12,nVar11);
    nVar11 = nsync_time_now();
    nVar12.tv_nsec = 999999999;
    nVar12.tv_sec = 0x7fffffffffffffff;
    uVar2 = nsync_cv_wait_with_deadline(&cv,&mu,nVar12,cancel_note);
    if (uVar2 != 0x7d) {
      pcVar5 = smprintf("nsync_cv_wait() returned non-cancelled (%d) for a cancellation; expected %d"
                        ,(ulong)uVar2,0x7d);
      testing_error_(t,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x131,pcVar5);
    }
    nVar12 = nsync_time_now();
    iVar4 = nsync_time_cmp(nVar12,nVar11);
    if (iVar4 < 0) {
      nVar10 = nsync_time_sub(nVar10,nVar12);
      pcVar5 = nsync_time_str(nVar10,2);
      pcVar6 = smprintf("nsync_cv_wait() returned %s too early",pcVar5);
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                     ,0x136,pcVar6);
      free(pcVar5);
    }
    nVar10 = nsync_time_add(nVar11,b_00);
    iVar4 = nsync_time_cmp(nVar10,nVar12);
    uVar7 = (uVar7 - (iVar3 >> 0x1f)) - (iVar4 >> 0x1f);
    nsync_note_notify(cancel_note);
    nsync_note_free(cancel_note);
  }
  nsync_mu_unlock(&mu);
  if (0x19 < (int)uVar7) {
    pcVar5 = smprintf("nsync_cv_wait() returned too late %d times",(ulong)uVar7);
    testing_error_(t,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/testing/cv_test.c"
                   ,0x142,pcVar5);
  }
  return;
}

Assistant:

static void test_cv_cancel (testing t) {
	nsync_time future_time;
	int too_late_violations;
	nsync_mu mu;
	nsync_cv cv;
	int i;
	nsync_time too_early;
	nsync_time too_late;

	nsync_mu_init (&mu);
	nsync_cv_init (&cv);
	too_early = nsync_time_ms (TOO_EARLY_MS);
	too_late = nsync_time_ms (TOO_LATE_MS);

	/* The loops below cancel after 87 milliseconds, like the timeout tests above. */

	future_time = nsync_time_add (nsync_time_now (), nsync_time_ms (3600000)); /* test cancels with timeout */

	too_late_violations = 0;
	nsync_mu_lock (&mu);
	for (i = 0; i != 50; i++) {
		int x;
		nsync_note cancel;
		nsync_time end_time;
		nsync_time start_time;
		nsync_time expected_end_time;
		start_time = nsync_time_now ();
		expected_end_time = nsync_time_add (start_time, nsync_time_ms (87));

		cancel = nsync_note_new (NULL, expected_end_time);

		x = nsync_cv_wait_with_deadline (&cv, &mu, future_time, cancel);
		if (x != ECANCELED) {
			TEST_FATAL (t, ("nsync_cv_wait() returned non-cancelled (%d) for "
				   "a cancellation; expected %d",
				   x, ECANCELED));
		}
		end_time = nsync_time_now ();
		if (nsync_time_cmp (end_time, nsync_time_sub (expected_end_time, too_early)) < 0) {
			char *elapsed_str = nsync_time_str (nsync_time_sub (expected_end_time, end_time), 2);
			TEST_ERROR (t, ("nsync_cv_wait() returned %s too early", elapsed_str));
			free (elapsed_str);
		}
		if (nsync_time_cmp (nsync_time_add (expected_end_time, too_late), end_time) < 0) {
			too_late_violations++;
		}

		/* Check that an already cancelled wait returns immediately. */
		start_time = nsync_time_now ();

		x = nsync_cv_wait_with_deadline (&cv, &mu, nsync_time_no_deadline, cancel);
		if (x != ECANCELED) {
			TEST_FATAL (t, ("nsync_cv_wait() returned non-cancelled (%d) for "
				   "a cancellation; expected %d",
				   x, ECANCELED));
		}
		end_time = nsync_time_now ();
		if (nsync_time_cmp (end_time, start_time) < 0) {
			char *elapsed_str = nsync_time_str (nsync_time_sub (expected_end_time, end_time), 2);
			TEST_ERROR (t, ("nsync_cv_wait() returned %s too early", elapsed_str));
			free (elapsed_str);
		}
		if (nsync_time_cmp (nsync_time_add (start_time, too_late), end_time) < 0) {
			too_late_violations++;
		}
		nsync_note_notify (cancel);

		nsync_note_free (cancel);
	}
	nsync_mu_unlock (&mu);
	if (too_late_violations > TOO_LATE_ALLOWED) {
		TEST_ERROR (t, ("nsync_cv_wait() returned too late %d times", too_late_violations));
	}
}